

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

ostream * __thiscall smf::Options::printOptionListBooleanState(Options *this,ostream *out)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  
  for (p_Var2 = (this->m_optionList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_optionList)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return out;
}

Assistant:

std::ostream& Options::printOptionListBooleanState(std::ostream& out) {
   for (auto it = m_optionList.begin(); it != m_optionList.end(); it++) {
      out << it->first << "\t"
          << m_optionRegister[it->second]->isModified() << std::endl;
   }
   return out;
}